

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  iVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; (int)lVar7 < count[lVar5]; lVar7 = lVar7 + 1) {
      h->size[lVar7 + iVar6] = (char)lVar5 + '\x01';
    }
    iVar6 = iVar6 + (int)lVar7;
  }
  h->size[iVar6] = '\0';
  uVar8 = 0;
  uVar2 = 1;
  iVar6 = 0;
  do {
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      uVar3 = 0;
      uVar2 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar2 = uVar3;
      }
      for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
        if (h->size[uVar3] < 10) {
          uVar1 = h->code[uVar3];
          bVar4 = 9 - h->size[uVar3];
          for (lVar5 = 0; (uint)lVar5 >> (bVar4 & 0x1f) == 0; lVar5 = lVar5 + 1) {
            h->fast[lVar5 + ((ulong)uVar1 << (bVar4 & 0x3f))] = (stbi_uc)uVar3;
          }
        }
      }
      return 1;
    }
    h->delta[uVar2] = uVar8 - iVar6;
    lVar5 = (long)(int)uVar8;
    uVar3 = (ulong)h->size[lVar5];
    if (uVar2 == uVar3) {
      while (uVar2 == uVar3) {
        h->code[lVar5] = (stbi__uint16)iVar6;
        iVar6 = iVar6 + 1;
        lVar7 = lVar5 + 1;
        lVar5 = lVar5 + 1;
        uVar8 = uVar8 + 1;
        uVar3 = (ulong)h->size[lVar7];
      }
      if (1 << ((byte)uVar2 & 0x1f) < iVar6) {
        stbi__g_failure_reason = "bad code lengths";
        return 0;
      }
    }
    h->maxcode[uVar2] = iVar6 << (0x10 - (byte)uVar2 & 0x1f);
    iVar6 = iVar6 * 2;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0,code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1 << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}